

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_2_channels_with_n_coeffs_mod2
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pfVar1 = output_buffer + output_sub_size * 2;
  pfVar4 = horizontal_coefficients + 4;
  do {
    lVar6 = (long)(horizontal_contributors->n0 * 2);
    pfVar2 = decode_buffer + lVar6;
    fVar12 = *pfVar2 * *horizontal_coefficients;
    fVar13 = pfVar2[1] * *horizontal_coefficients;
    fVar14 = pfVar2[2] * horizontal_coefficients[1];
    fVar15 = pfVar2[3] * horizontal_coefficients[1];
    fVar8 = horizontal_coefficients[2] * pfVar2[4];
    fVar9 = horizontal_coefficients[2] * pfVar2[5];
    fVar10 = horizontal_coefficients[3] * pfVar2[6];
    fVar11 = horizontal_coefficients[3] * pfVar2[7];
    iVar3 = ((horizontal_contributors->n1 - horizontal_contributors->n0) + -2 >> 2) + 1;
    pfVar2 = decode_buffer + lVar6 + 8;
    pfVar7 = pfVar4;
    do {
      pfVar5 = pfVar2;
      fVar12 = fVar12 + *pfVar5 * *pfVar7;
      fVar13 = fVar13 + pfVar5[1] * *pfVar7;
      fVar14 = fVar14 + pfVar5[2] * pfVar7[1];
      fVar15 = fVar15 + pfVar5[3] * pfVar7[1];
      fVar8 = fVar8 + pfVar7[2] * pfVar5[4];
      fVar9 = fVar9 + pfVar7[2] * pfVar5[5];
      fVar10 = fVar10 + pfVar7[3] * pfVar5[6];
      fVar11 = fVar11 + pfVar7[3] * pfVar5[7];
      iVar3 = iVar3 + -1;
      pfVar7 = pfVar7 + 4;
      pfVar2 = pfVar5 + 8;
    } while (1 < iVar3);
    fVar16 = (float)*(undefined8 *)pfVar7;
    fVar17 = (float)((ulong)*(undefined8 *)pfVar7 >> 0x20);
    *(ulong *)output_buffer =
         CONCAT44(fVar11 + fVar15 + pfVar5[0xb] * fVar17 + fVar9 + fVar13 + pfVar5[9] * fVar16,
                  fVar10 + fVar14 + pfVar5[10] * fVar17 + fVar8 + fVar12 + pfVar5[8] * fVar16);
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 2;
    pfVar4 = pfVar4 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod2 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 6 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__2_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}